

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O3

void __thiscall
amrex::STLtools::fill
          (STLtools *this,MultiFab *mf,IntVect *nghost,Geometry *geom,Real outside_value,
          Real inside_value)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  pointer pTVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ulong uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 uVar27;
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  pointer pTVar32;
  XDim3 *pXVar33;
  Real RVar34;
  Real RVar35;
  int iVar36;
  int iVar37;
  int *piVar38;
  uint uVar39;
  long lVar40;
  int iVar41;
  uint uVar42;
  double *pdVar43;
  double *pdVar44;
  byte bVar45;
  long lVar46;
  Array4<double> *pAVar47;
  byte bVar48;
  bool bVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  double dVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined4 uVar59;
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  ulong uVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  MFIter mfi;
  Real local_598;
  Real local_588;
  double dStack_550;
  ulong local_548;
  double dStack_530;
  double dStack_520;
  double dStack_500;
  Box local_474;
  Real local_458;
  undefined8 uStack_450;
  double local_448;
  double dStack_440;
  double local_438;
  undefined8 uStack_430;
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  double local_408;
  undefined8 uStack_400;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  double local_3d8;
  undefined8 uStack_3d0;
  Array4<double> *local_3c8;
  IntVect *local_3c0;
  Real local_3b8;
  Real local_3b0;
  Real local_3a8;
  Real local_3a0;
  long local_398;
  ulong local_390;
  Real local_388;
  Real local_380;
  Real local_378;
  Real local_370;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  double local_348;
  double dStack_340;
  double local_338;
  undefined8 uStack_330;
  undefined1 local_328 [16];
  Real local_318;
  undefined8 uStack_310;
  double local_308;
  undefined8 uStack_300;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  double local_2d8;
  undefined8 uStack_2d0;
  undefined1 local_2c8 [16];
  double local_2b8;
  undefined8 uStack_2b0;
  undefined1 local_2a8 [16];
  double local_298;
  double dStack_290;
  double local_288;
  double dStack_280;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  double local_258;
  double dStack_250;
  double local_248;
  undefined8 uStack_240;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  double local_218;
  double dStack_210;
  undefined1 local_208 [16];
  double local_1f8;
  undefined8 uStack_1f0;
  double local_1e8;
  undefined8 uStack_1e0;
  double local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  double local_1a8;
  double dStack_1a0;
  double local_198;
  double dStack_190;
  double local_188;
  undefined8 uStack_180;
  undefined1 local_178 [16];
  double local_168;
  undefined8 uStack_160;
  Real local_158;
  undefined8 uStack_150;
  double local_148;
  undefined8 uStack_140;
  double adStack_130 [6];
  Real local_100;
  Real RStack_f8;
  Real local_f0;
  Real local_e8;
  Real RStack_e0;
  Real local_d8;
  Real local_d0;
  Real RStack_c8;
  Real local_c0;
  Real local_a0;
  Real local_98;
  MFIter local_90;
  
  uVar6 = this->m_num_tri;
  dVar1 = (geom->prob_domain).xlo[0];
  local_3a0 = (geom->prob_domain).xlo[1];
  local_3b0 = (geom->prob_domain).xlo[2];
  dVar2 = (geom->super_CoordSys).dx[0];
  local_3a8 = (geom->super_CoordSys).dx[1];
  local_3b8 = (geom->super_CoordSys).dx[2];
  pTVar10 = (this->m_tri_pts_d).m_data;
  local_f0 = (this->m_ptmin).z;
  local_100 = (this->m_ptmin).x;
  RStack_f8 = (this->m_ptmin).y;
  local_d8 = (this->m_ptmax).z;
  local_e8 = (this->m_ptmax).x;
  RStack_e0 = (this->m_ptmax).y;
  local_d0 = (this->m_ptref).x;
  RStack_c8 = (this->m_ptref).y;
  local_c0 = (this->m_ptref).z;
  local_598 = inside_value;
  local_588 = outside_value;
  if (this->m_boundry_is_outside == false) {
    local_598 = outside_value;
    local_588 = inside_value;
  }
  local_3c0 = nghost;
  FabArray<amrex::FArrayBox>::build_arrays<amrex::FArrayBox,_0>
            (&mf->super_FabArray<amrex::FArrayBox>);
  local_3c8 = (mf->super_FabArray<amrex::FArrayBox>).m_arrays.hp;
  local_a0 = local_588;
  local_98 = local_598;
  local_474.smallend.vect[1] = Gpu::Device::max_gpu_streams;
  local_474.smallend.vect[2] = (undefined4)FabArrayBase::mfiter_tile_size;
  local_474.bigend.vect[0] = FabArrayBase::mfiter_tile_size._4_4_;
  local_474.bigend.vect[1] = DAT_00717ec0;
  local_474.smallend.vect[0] = CONCAT13(local_474.smallend.vect[0]._3_1_,0x10001);
  MFIter::MFIter(&local_90,(FabArrayBase *)mf,(MFItInfo *)&local_474);
  RVar35 = local_c0;
  RVar34 = local_d0;
  if (local_90.currentIndex < local_90.endIndex) {
    local_318 = local_100;
    uStack_310 = 0;
    local_370 = RStack_f8;
    local_158 = local_e8;
    uStack_150 = 0;
    local_378 = RStack_e0;
    local_380 = local_f0;
    local_388 = local_d8;
    local_308 = (double)((ulong)RStack_c8 ^ (ulong)DAT_0065b980);
    uStack_300 = DAT_0065b980._8_8_;
    uVar20 = (ulong)DAT_0065b980 ^ (ulong)local_c0;
    local_3e8._8_4_ = DAT_0065b980._8_4_;
    local_3e8._0_8_ = uVar20;
    local_3e8._12_4_ = DAT_0065b980._12_4_;
    local_358._8_4_ = SUB84(RStack_c8,0);
    local_358._0_8_ = uVar20;
    local_358._12_4_ = (int)((ulong)RStack_c8 >> 0x20);
    local_458 = RStack_c8;
    uStack_450 = 0;
    local_268._8_8_ = RStack_c8;
    local_268._0_8_ = RStack_c8;
    local_278._8_4_ = SUB84(local_d0,0);
    local_278._0_8_ = local_d0;
    local_278._12_4_ = (int)((ulong)local_d0 >> 0x20);
    local_288 = local_c0;
    dStack_280 = local_c0;
    do {
      MFIter::growntilebox(&local_474,&local_90,local_3c0);
      piVar38 = &local_90.currentIndex;
      if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar38 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + local_90.currentIndex;
      }
      local_548 = local_474._8_8_ & 0xffffffff;
      if (local_474.smallend.vect[2] <= local_474.bigend.vect[2]) {
        local_390 = (ulong)(uint)local_474.bigend.vect[0];
        pAVar47 = local_3c8 + *piVar38;
        do {
          iVar36 = (int)local_548;
          if (local_474.smallend.vect[1] <= local_474.bigend.vect[1]) {
            local_3d8 = (double)iVar36 * local_3b8 + local_3b0;
            local_148 = local_3d8;
            if (local_3d8 <= RVar35) {
              local_148 = RVar35;
            }
            uStack_140 = 0;
            local_1d8 = local_3d8;
            if (RVar35 <= local_3d8) {
              local_1d8 = RVar35;
            }
            uStack_1d0 = 0;
            dVar16 = RVar35 - local_3d8;
            local_2e8._0_8_ = -local_3d8;
            local_2a8._8_4_ = SUB84(local_3d8,0);
            local_2a8._0_8_ = local_3d8;
            local_2a8._12_4_ = (int)((ulong)local_3d8 >> 0x20);
            uStack_2d0 = 0x8000000000000000;
            local_2e8._8_4_ = SUB84(local_3d8,0);
            local_2e8._12_4_ = (int)((ulong)local_2e8._0_8_ >> 0x20);
            local_368._8_8_ = local_3d8;
            local_368._0_8_ = local_2e8._0_8_;
            local_228._8_8_ = 0;
            local_228._0_8_ = dVar16;
            local_238._8_4_ = SUB84(dVar16,0);
            local_238._0_8_ = dVar16;
            local_238._12_4_ = (int)((ulong)dVar16 >> 0x20);
            local_398 = (long)iVar36;
            uStack_3d0 = 0;
            iVar41 = local_474.smallend.vect[1];
            do {
              if (local_474.smallend.vect[0] <= local_474.bigend.vect[0]) {
                iVar7 = (pAVar47->begin).y;
                lVar11 = pAVar47->jstride;
                iVar8 = (pAVar47->begin).z;
                lVar12 = pAVar47->kstride;
                pdVar13 = pAVar47->p;
                iVar9 = (pAVar47->begin).x;
                local_298 = (double)iVar41 * local_3a8 + local_3a0;
                dVar82 = local_298;
                if (local_298 <= local_458) {
                  dVar82 = local_458;
                }
                dVar87 = local_298;
                if (local_458 <= local_298) {
                  dVar87 = local_458;
                }
                local_218 = local_458 * local_3d8 + local_298 * (double)local_3e8._0_8_;
                local_1f8 = local_298 - local_458;
                local_2c8._0_8_ = -local_298;
                uStack_2b0 = 0x8000000000000000;
                local_2c8._8_4_ = SUB84(local_298,0);
                local_2c8._12_4_ = (int)((ulong)local_2c8._0_8_ >> 0x20);
                uStack_1f0 = 0;
                local_208._8_4_ = SUB84(local_1f8,0);
                local_208._0_8_ = local_1f8;
                local_208._12_4_ = (int)((ulong)local_1f8 >> 0x20);
                uStack_1e0 = uStack_450;
                lVar46 = (long)local_474.smallend.vect[0];
                do {
                  dVar28 = (double)(int)lVar46 * dVar2 + dVar1;
                  lVar40 = 0x90;
                  if (((((local_370 <= local_298 && local_298 <= local_378) &&
                        local_380 <= local_3d8) && local_3d8 <= local_388) && 0 < (int)uVar6) &&
                      (local_318 <= dVar28 && dVar28 <= local_158)) {
                    dVar64 = dVar28;
                    if (dVar28 <= RVar34) {
                      dVar64 = RVar34;
                    }
                    uVar27 = 0;
                    dVar84 = dVar28;
                    if (RVar34 <= dVar28) {
                      dVar84 = RVar34;
                    }
                    local_1a8 = RVar34 * local_298 + dVar28 * local_308;
                    dVar21 = RVar34 * local_3d8 + dVar28 * (double)local_3e8._0_8_;
                    local_198 = RVar34 - dVar28;
                    local_1c8._8_4_ = SUB84(dVar28,0);
                    local_1c8._0_8_ = dVar28;
                    local_1c8._12_4_ = (int)((ulong)dVar28 >> 0x20);
                    uStack_180 = 0;
                    uStack_160 = 0;
                    local_178._8_8_ = 0;
                    local_178._0_8_ = dVar21;
                    local_1b8._8_4_ = SUB84(dVar21,0);
                    local_1b8._0_8_ = dVar21;
                    local_1b8._12_4_ = (int)((ulong)dVar21 >> 0x20);
                    lVar40 = 0;
                    uVar39 = 0;
                    do {
                      dVar3 = *(double *)((long)&(pTVar10->v1).x + lVar40);
                      dVar4 = *(double *)((long)&(pTVar10->v2).x + lVar40);
                      dVar79 = *(double *)((long)&(pTVar10->v3).x + lVar40);
                      uVar52 = (undefined4)((ulong)dVar4 >> 0x20);
                      uVar53 = (undefined4)((ulong)dVar3 >> 0x20);
                      uVar51 = SUB84(dVar4,0);
                      uVar50 = uVar52;
                      if (dVar3 <= dVar4) {
                        uVar51 = SUB84(dVar3,0);
                        uVar50 = uVar53;
                      }
                      dVar89 = dVar79;
                      if ((double)CONCAT44(uVar50,uVar51) <= dVar79) {
                        dVar89 = (double)CONCAT44(uVar50,uVar51);
                      }
                      if (dVar89 <= dVar64) {
                        uVar51 = SUB84(dVar4,0);
                        pTVar32 = (pointer)&pTVar10->v2;
                        if (dVar4 <= dVar3) {
                          uVar51 = SUB84(dVar3,0);
                          uVar52 = uVar53;
                          pTVar32 = pTVar10;
                        }
                        if ((double)CONCAT44(uVar52,uVar51) <= dVar79 &&
                            dVar79 != (double)CONCAT44(uVar52,uVar51)) {
                          pTVar32 = (pointer)&pTVar10->v3;
                        }
                        pdVar43 = (double *)((long)&(pTVar32->v1).x + lVar40);
                        if (dVar84 < *pdVar43 || dVar84 == *pdVar43) {
                          dVar89 = *(double *)((long)&(pTVar10->v1).y + lVar40);
                          dVar65 = *(double *)((long)&(pTVar10->v2).y + lVar40);
                          dVar67 = *(double *)((long)&(pTVar10->v3).y + lVar40);
                          uVar50 = SUB84(dVar65,0);
                          uVar53 = (undefined4)((ulong)dVar65 >> 0x20);
                          uVar54 = (undefined4)((ulong)dVar89 >> 0x20);
                          uVar51 = uVar50;
                          uVar52 = uVar53;
                          if (dVar89 <= dVar65) {
                            uVar51 = SUB84(dVar89,0);
                            uVar52 = uVar54;
                          }
                          uVar61 = (undefined4)((ulong)dVar67 >> 0x20);
                          uVar59 = SUB84(dVar67,0);
                          uVar60 = uVar61;
                          if ((double)CONCAT44(uVar52,uVar51) <= dVar67) {
                            uVar59 = uVar51;
                            uVar60 = uVar52;
                          }
                          if ((double)CONCAT44(uVar60,uVar59) < dVar82 ||
                              (double)CONCAT44(uVar60,uVar59) == dVar82) {
                            uVar51 = uVar50;
                            uVar52 = uVar53;
                            pXVar33 = &pTVar10->v2;
                            if (dVar65 <= dVar89) {
                              uVar51 = SUB84(dVar89,0);
                              uVar52 = uVar54;
                              pXVar33 = &pTVar10->v1;
                            }
                            if ((double)CONCAT44(uVar52,uVar51) <= dVar67 &&
                                dVar67 != (double)CONCAT44(uVar52,uVar51)) {
                              pXVar33 = &pTVar10->v3;
                            }
                            pdVar43 = (double *)((long)&pXVar33->y + lVar40);
                            if (dVar87 < *pdVar43 || dVar87 == *pdVar43) {
                              dVar5 = *(double *)((long)&(pTVar10->v1).z + lVar40);
                              dVar90 = *(double *)((long)&(pTVar10->v2).z + lVar40);
                              dVar55 = *(double *)((long)&(pTVar10->v3).z + lVar40);
                              uVar52 = (undefined4)((ulong)dVar90 >> 0x20);
                              uVar59 = (undefined4)((ulong)dVar5 >> 0x20);
                              uVar51 = SUB84(dVar90,0);
                              uVar54 = uVar52;
                              if (dVar5 <= dVar90) {
                                uVar51 = SUB84(dVar5,0);
                                uVar54 = uVar59;
                              }
                              uVar62 = (undefined4)((ulong)dVar55 >> 0x20);
                              uVar60 = SUB84(dVar55,0);
                              uVar63 = uVar62;
                              if ((double)CONCAT44(uVar54,uVar51) <= dVar55) {
                                uVar60 = uVar51;
                                uVar63 = uVar54;
                              }
                              if ((double)CONCAT44(uVar63,uVar60) < local_148 ||
                                  (double)CONCAT44(uVar63,uVar60) == local_148) {
                                uVar51 = SUB84(dVar90,0);
                                pXVar33 = &pTVar10->v2;
                                if (dVar90 <= dVar5) {
                                  uVar51 = SUB84(dVar5,0);
                                  uVar52 = uVar59;
                                  pXVar33 = &pTVar10->v1;
                                }
                                pdVar43 = (double *)((long)&(pTVar10->v3).z + lVar40);
                                pdVar44 = (double *)((long)&pXVar33->z + lVar40);
                                if ((double)CONCAT44(uVar52,uVar51) <= dVar55 &&
                                    dVar55 != (double)CONCAT44(uVar52,uVar51)) {
                                  pdVar44 = pdVar43;
                                }
                                if (local_1d8 < *pdVar44 || local_1d8 == *pdVar44) {
                                  local_3f8._8_8_ = 0;
                                  local_3f8._0_8_ = dVar28;
                                  auVar57._8_4_ = uVar50;
                                  auVar57._0_8_ = dVar89;
                                  auVar57._12_4_ = uVar53;
                                  auVar75._8_4_ = SUB84(dVar4 - dVar79,0);
                                  auVar75._0_8_ = dVar3 - dVar4;
                                  auVar75._12_4_ = (int)((ulong)(dVar4 - dVar79) >> 0x20);
                                  uStack_430 = 0;
                                  auVar18._8_4_ = SUB84(dVar90 - dVar55,0);
                                  auVar18._0_8_ = dVar5 - dVar90;
                                  auVar18._12_4_ = (int)((ulong)(dVar90 - dVar55) >> 0x20);
                                  local_328._8_4_ = SUB84(dVar67,0);
                                  local_328._0_8_ = dVar89;
                                  local_328._12_4_ = uVar61;
                                  dVar29 = dVar65 - dVar89;
                                  local_2f8._8_4_ = SUB84(dVar89 - dVar67,0);
                                  local_2f8._0_8_ = dVar29;
                                  local_2f8._12_4_ = (int)((ulong)(dVar89 - dVar67) >> 0x20);
                                  dVar85 = dVar67 - dVar65;
                                  local_428._0_8_ = dVar79 * dVar89 - dVar3 * dVar67;
                                  local_428._8_8_ = 0;
                                  local_418._0_8_ = dVar79 * dVar5 - dVar3 * dVar55;
                                  local_418._8_8_ = 0;
                                  local_248 = dVar67 * dVar5 - dVar89 * dVar55;
                                  dStack_550 = auVar57._8_8_;
                                  dVar71 = dVar4 * dVar67 - dVar79 * dStack_550;
                                  dVar66 = dVar4 * dVar55 - dVar79 * dVar90;
                                  local_348 = dVar90 * dVar89 - dVar65 * dVar5;
                                  dStack_340 = dVar55 * dStack_550 - dVar67 * dVar90;
                                  dStack_530 = auVar18._8_8_;
                                  dStack_500 = auVar75._8_8_;
                                  dVar70 = local_1f8 * (dVar3 * dVar90 - dVar4 * dVar5) +
                                           dVar16 * (dVar3 * dVar65 - dVar4 * dVar89) +
                                           local_218 * (dVar3 - dVar4) +
                                           local_198 * local_348 +
                                           local_1a8 * (dVar5 - dVar90) + dVar21 * dVar29;
                                  dVar17 = (double)local_208._8_8_ * dVar66 +
                                           (double)local_238._8_8_ * dVar71 +
                                           local_218 * dStack_500 +
                                           local_198 * dStack_340 +
                                           local_1a8 * dStack_530 + (double)local_1b8._8_8_ * dVar85
                                  ;
                                  dVar86 = dVar55 - dVar5;
                                  local_258 = (double)local_2f8._8_8_;
                                  dStack_250 = (double)local_2f8._8_8_;
                                  uStack_240 = 0;
                                  local_338 = dVar79 - dVar3;
                                  uStack_330 = 0;
                                  dVar22 = local_1f8 * (double)local_418._0_8_ +
                                           dVar16 * (double)local_428._0_8_ +
                                           local_218 * local_338 +
                                           local_198 * local_248 +
                                           local_1a8 * dVar86 + dVar21 * (double)local_2f8._8_8_;
                                  auVar26._8_4_ = (int)-(ulong)(ABS(dVar17) < 2.220446049250313e-16)
                                  ;
                                  auVar26._0_8_ = -(ulong)(ABS(dVar70) < 2.220446049250313e-16);
                                  auVar26._12_4_ =
                                       (int)(-(ulong)(ABS(dVar17) < 2.220446049250313e-16) >> 0x20);
                                  uVar42 = movmskpd((int)pdVar44,auVar26);
                                  bVar48 = (byte)uVar42;
                                  dVar68 = ABS(dVar22);
                                  bVar45 = dVar68 < 2.220446049250313e-16 & bVar48 >> 1;
                                  local_438 = dVar90;
                                  local_408 = dVar84;
                                  uStack_400 = uVar27;
                                  if (((uVar42 & 1) == 0) || (bVar45 == 0)) {
                                    dVar79 = -dVar5;
                                    local_448 = dVar3;
                                    dStack_440 = dVar4;
                                    if ((0.0 <= dVar22) || ((0.0 <= dVar70 || (0.0 <= dVar17)))) {
                                      auVar30._8_8_ = -(ulong)(0.0 < dVar17);
                                      auVar30._0_8_ = -(ulong)(0.0 < dVar70);
                                      iVar37 = movmskpd((int)pdVar43,auVar30);
                                      if (((0.0 < dVar22) && (iVar37 == 3)) ||
                                         ((((bVar48 & 0.0 < dVar17 * dVar22) != 0 ||
                                           ((bVar48 >> 1 & 0.0 < dVar22 * dVar70) != 0)) ||
                                          ((dVar68 < 2.220446049250313e-16 &&
                                           (0.0 < dVar17 * dVar70)))))) goto LAB_0064411b;
                                      if ((uVar42 & 1) == 0) {
                                        if (bVar45 == 0) goto LAB_0064426e;
LAB_006443e7:
                                        dVar3 = (dVar85 * (dVar28 * dVar5 + dVar3 * local_2e8._0_8_)
                                                + dStack_530 *
                                                  (dVar28 * dVar89 + local_2c8._0_8_ * dVar3) +
                                                  dStack_340 * (dVar28 - dVar3) +
                                                  dStack_500 *
                                                  (local_298 * dVar5 + local_2e8._0_8_ * dVar89) +
                                                  dVar71 * (local_3d8 - dVar5) +
                                                  dVar66 * (dVar89 - local_298)) *
                                                (dVar85 * (dVar3 * RVar35 + RVar34 * dVar79) +
                                                dStack_530 * (dVar3 * local_458 + -dVar89 * RVar34)
                                                + dStack_340 * (dVar3 - RVar34) +
                                                  dStack_500 *
                                                  (dVar89 * RVar35 + dVar79 * local_458) +
                                                  dVar71 * (dVar5 - RVar35) +
                                                  dVar66 * (local_458 - dVar89));
                                      }
                                      else {
                                        if (bVar48 >> 1 != 0) goto LAB_006443e7;
                                        if (2.220446049250313e-16 <= dVar68) goto LAB_0064426e;
                                        dVar3 = ((double)local_2f8._8_8_ *
                                                 (dVar28 * dVar90 + dVar4 * (double)local_2e8._8_8_)
                                                + dVar86 * (dVar28 * dVar65 +
                                                           (double)local_2c8._8_8_ * dVar4) +
                                                  local_248 * (dVar28 - dVar4) +
                                                  local_338 *
                                                  (local_298 * dVar90 +
                                                  (double)local_2e8._8_8_ * dVar65) +
                                                  (double)local_428._0_8_ * (local_3d8 - dVar90) +
                                                  (double)local_418._0_8_ * (dVar65 - local_298)) *
                                                ((double)local_2f8._8_8_ *
                                                 (dVar4 * RVar35 + RVar34 * -dVar90) +
                                                dVar86 * (dVar4 * local_458 + -dStack_550 * RVar34)
                                                + local_248 * (dVar4 - RVar34) +
                                                  local_338 *
                                                  (dVar65 * RVar35 + -dVar90 * local_458) +
                                                  (double)local_428._0_8_ * (dVar90 - RVar35) +
                                                  (double)local_418._0_8_ * (local_458 - dVar65));
                                      }
                                    }
                                    else {
LAB_0064411b:
                                      dVar3 = (dVar85 * (RVar34 * dVar5 +
                                                        dVar3 * (double)local_3e8._0_8_) +
                                              dStack_530 * (RVar34 * dVar89 + local_308 * dVar3) +
                                              dStack_340 * (RVar34 - dVar3) +
                                              dStack_500 *
                                              ((double)local_358._8_8_ * dVar5 +
                                              (double)local_3e8._0_8_ * dVar89) +
                                              dVar71 * (RVar35 - dVar5) +
                                              dVar66 * (dVar89 - (double)local_358._8_8_)) *
                                              (dVar85 * (dVar3 * local_3d8 + dVar28 * dVar79) +
                                              dStack_530 * (dVar3 * local_298 + -dVar89 * dVar28) +
                                              dStack_340 * (dVar3 - dVar28) +
                                              dStack_500 * (dVar89 * local_3d8 + dVar79 * local_298)
                                              + dVar71 * (dVar5 - local_3d8) +
                                                dVar66 * (local_298 - dVar89));
                                    }
                                    dVar67 = dVar4;
                                    if (dVar3 <= 0.0) goto LAB_0064426e;
                                  }
                                  else {
                                    dVar68 = dVar4 - dVar3;
                                    dVar23 = dVar3 - dVar79;
                                    auVar14._8_4_ = SUB84(dVar55,0);
                                    auVar14._0_8_ = dVar5;
                                    auVar14._12_4_ = uVar62;
                                    dVar69 = dVar90 - dVar5;
                                    dVar72 = dVar5 - dVar55;
                                    dVar70 = (double)local_278._0_8_ - dVar3;
                                    auVar15._8_4_ = SUB84((double)local_278._8_8_ - dVar4,0);
                                    auVar15._0_8_ = dVar70;
                                    auVar15._12_4_ =
                                         (int)((ulong)((double)local_278._8_8_ - dVar4) >> 0x20);
                                    dVar81 = dVar79 - dVar4;
                                    dVar88 = dVar55 - dVar90;
                                    local_448 = -dVar88;
                                    dStack_530 = auVar15._8_8_;
                                    dVar78 = dVar68 * ((double)local_268._0_8_ - dVar89) +
                                             -dVar29 * dVar70;
                                    dVar80 = dVar81 * ((double)local_268._8_8_ - dStack_550) +
                                             -dVar85 * dStack_530;
                                    uVar83 = (ulong)DAT_0065b980;
                                    dVar17 = (double)((ulong)dVar69 ^ uVar83);
                                    uVar20 = (ulong)dVar72 ^ DAT_0065b980._8_8_;
                                    local_418._8_4_ = (int)uVar20;
                                    local_418._0_8_ = dVar17;
                                    local_418._12_4_ = (int)(uVar20 >> 0x20);
                                    dStack_440 = -0.0;
                                    dVar76 = dVar29 * (local_288 - dVar5) +
                                             dVar17 * ((double)local_268._0_8_ - dVar89);
                                    dVar77 = dVar85 * (dStack_280 - dVar90) +
                                             local_448 * ((double)local_268._8_8_ - dStack_550);
                                    dVar22 = (double)((ulong)dVar68 ^ uVar83);
                                    uVar20 = (ulong)dVar23 ^ DAT_0065b980._8_8_;
                                    local_428._8_4_ = (int)uVar20;
                                    local_428._0_8_ = dVar22;
                                    local_428._12_4_ = (int)(uVar20 >> 0x20);
                                    dVar71 = dVar69 * dVar70 + dVar22 * (local_288 - dVar5);
                                    dVar24 = dVar88 * dStack_530 +
                                             (double)((ulong)dVar81 ^ uVar83) *
                                             (dStack_280 - dVar90);
                                    auVar56._0_8_ = (dVar67 - dVar89) * dVar69;
                                    auVar56._8_8_ =
                                         ((double)local_358._8_8_ - (double)local_328._8_8_) *
                                         dVar72;
                                    dVar70 = dVar29 * dVar86 - auVar56._0_8_;
                                    dVar66 = (double)local_2f8._8_8_ * (RVar35 - dVar55) -
                                             auVar56._8_8_;
                                    dVar86 = dVar69 * local_338 - dVar86 * dVar68;
                                    dVar73 = dVar72 * (RVar34 - dVar79) - (RVar35 - dVar55) * dVar23
                                    ;
                                    auVar74._0_8_ = local_338 * dVar29;
                                    auVar74._8_8_ = (RVar34 - dVar79) * (double)local_2f8._8_8_;
                                    dVar67 = dVar68 * (dVar67 - dVar89) - auVar74._0_8_;
                                    dVar55 = dVar23 * ((double)local_358._8_8_ -
                                                      (double)local_328._8_8_) - auVar74._8_8_;
                                    auVar31._8_8_ =
                                         dVar80 * dVar80 + dVar77 * dVar77 + dVar24 * dVar24;
                                    auVar31._0_8_ =
                                         dVar78 * dVar78 + dVar76 * dVar76 + dVar71 * dVar71;
                                    auVar75 = sqrtpd(auVar74,auVar31);
                                    dVar55 = dVar55 * dVar55 + dVar66 * dVar66 + dVar73 * dVar73;
                                    auVar19._8_4_ = SUB84(dVar55,0);
                                    auVar19._0_8_ =
                                         dVar67 * dVar67 + dVar70 * dVar70 + dVar86 * dVar86;
                                    auVar19._12_4_ = (int)((ulong)dVar55 >> 0x20);
                                    auVar57 = sqrtpd(auVar56,auVar19);
                                    dVar55 = auVar57._0_8_ * 0.5;
                                    dVar67 = -0.0;
                                    if (ABS((auVar57._8_8_ * 0.5 +
                                            auVar75._8_8_ * 0.5 + auVar75._0_8_ * 0.5) - dVar55) <=
                                        2.220446049250313e-16) {
                                      dStack_520 = auVar14._8_8_;
                                      dVar66 = dVar81 * (local_298 - dVar65) +
                                               -dVar85 * (dVar28 - dVar4);
                                      dVar70 = dVar85 * (local_3d8 - dVar90) +
                                               (local_298 - dVar65) * local_448;
                                      dVar4 = dVar88 * (dVar28 - dVar4) +
                                              (local_3d8 - dVar90) *
                                              (double)((ulong)dVar81 ^ uVar83);
                                      dVar65 = dVar68 * (local_298 - dVar89) +
                                               -dVar29 * (dVar28 - dVar3);
                                      dVar67 = dVar23 * (local_298 - (double)local_328._8_8_) +
                                               -(double)local_2f8._8_8_ *
                                               ((double)local_1c8._8_8_ - dVar79);
                                      dVar89 = dVar29 * (local_3d8 - dVar5) +
                                               (local_298 - dVar89) * dVar17;
                                      dVar90 = (double)local_2f8._8_8_ *
                                               ((double)local_2a8._8_8_ - dStack_520) +
                                               (local_298 - (double)local_328._8_8_) *
                                               (double)local_418._8_8_;
                                      auVar58._0_8_ = (local_3d8 - dVar5) * dVar22;
                                      auVar58._8_8_ =
                                           ((double)local_2a8._8_8_ - dStack_520) *
                                           (double)local_428._8_8_;
                                      dVar3 = dVar69 * (dVar28 - dVar3) + auVar58._0_8_;
                                      dVar79 = dVar72 * ((double)local_1c8._8_8_ - dVar79) +
                                               auVar58._8_8_;
                                      auVar25._8_8_ =
                                           dVar67 * dVar67 + dVar90 * dVar90 + dVar79 * dVar79;
                                      auVar25._0_8_ =
                                           dVar65 * dVar65 + dVar89 * dVar89 + dVar3 * dVar3;
                                      auVar57 = sqrtpd(auVar58,auVar25);
                                      dVar67 = dStack_440;
                                      dStack_440 = -0.0;
                                      if (ABS((auVar57._8_8_ * 0.5 +
                                              SQRT(dVar66 * dVar66 + dVar70 * dVar70 + dVar4 * dVar4
                                                  ) * 0.5 + auVar57._0_8_ * 0.5) - dVar55) <=
                                          2.220446049250313e-16) goto LAB_0064426e;
                                    }
                                  }
                                  dStack_440 = dVar67;
                                  uVar39 = uVar39 + 1;
                                }
                              }
                            }
                          }
                        }
                      }
LAB_0064426e:
                      lVar40 = lVar40 + 0x48;
                    } while ((ulong)uVar6 * 0x48 != lVar40);
                    lVar40 = (ulong)(uVar39 & 1) * 8 + 0x90;
                    dStack_1a0 = local_1a8;
                    dStack_190 = local_198;
                    local_188 = local_198;
                    local_168 = local_1a8;
                  }
                  pdVar13[((long)iVar41 - (long)iVar7) * lVar11 +
                          (local_398 - iVar8) * lVar12 + (lVar46 - iVar9)] =
                       *(double *)((long)adStack_130 + lVar40);
                  lVar46 = lVar46 + 1;
                  local_2b8 = local_2c8._0_8_;
                  dStack_290 = local_298;
                  dStack_210 = local_218;
                  local_1e8 = local_218;
                } while (local_474.bigend.vect[0] + 1U != (int)lVar46);
              }
              bVar49 = iVar41 != local_474.bigend.vect[1];
              iVar41 = iVar41 + 1;
              local_2d8 = local_2e8._0_8_;
            } while (bVar49);
          }
          local_548 = (ulong)(iVar36 + 1);
        } while (iVar36 != local_474.bigend.vect[2]);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  Gpu::Device::streamSynchronize();
  return;
}

Assistant:

void
STLtools::fill (MultiFab& mf, IntVect const& nghost, Geometry const& geom,
                Real outside_value, Real inside_value) const
{
    int num_triangles = m_num_tri;

    const auto plo = geom.ProbLoArray();
    const auto dx  = geom.CellSizeArray();

    const Triangle* tri_pts = m_tri_pts_d.data();
    XDim3 ptmin = m_ptmin;
    XDim3 ptmax = m_ptmax;
    XDim3 ptref = m_ptref;
    Real reference_value = m_boundry_is_outside ? outside_value :  inside_value;
    Real other_value     = m_boundry_is_outside ?  inside_value : outside_value;

    auto const& ma = mf.arrays();

    ParallelFor(mf, nghost, [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
    {
        Real coords[3];
        coords[0]=plo[0]+i*dx[0];
        coords[1]=plo[1]+j*dx[1];
#if (AMREX_SPACEDIM == 2)
        coords[2]=Real(0.);
#else
        coords[2]=plo[2]+k*dx[2];
#endif
        int num_intersects=0;
        if (coords[0] >= ptmin.x && coords[0] <= ptmax.x &&
            coords[1] >= ptmin.y && coords[1] <= ptmax.y &&
            coords[2] >= ptmin.z && coords[2] <= ptmax.z)
        {
            Real pr[]={ptref.x, ptref.y, ptref.z};
            for (int tr=0; tr < num_triangles; ++tr) {
                if (line_tri_intersects(pr, coords, tri_pts[tr])) {
                    ++num_intersects;
                }
            }
        }
        ma[box_no](i,j,k) = (num_intersects % 2 == 0) ? reference_value : other_value;
    });
    Gpu::streamSynchronize();
}